

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.hpp
# Opt level: O1

void __thiscall
poplar::
map<poplar::plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>,_poplar::compact_bonsai_nlm<int,_64UL>_>
::map(map<poplar::plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>,_poplar::compact_bonsai_nlm<int,_64UL>_>
      *this,uint32_t capa_bits,uint64_t lambda)

{
  undefined1 auVar1 [16];
  uint32_t uVar2;
  undefined8 *puVar3;
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  plain_bonsai_trie<90U,_poplar::hash::vigna_hasher> local_98;
  vector<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
  local_38;
  
  this->is_ready_ = false;
  this->lambda_ = 0x20;
  (this->hash_trie_).capa_size_.mask_ = 0;
  (this->hash_trie_).symb_size_.bits_ = 0;
  (this->hash_trie_).table_.chunks_.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->hash_trie_).table_.chunks_.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->hash_trie_).table_.chunks_.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->hash_trie_).table_.size_ = 0;
  (this->hash_trie_).table_.mask_ = 0;
  (this->hash_trie_).table_.width_ = 0;
  (this->hash_trie_).size_ = 0;
  (this->hash_trie_).max_size_ = 0;
  (this->hash_trie_).capa_size_.bits_ = 0;
  this->size_ = 0;
  (this->hash_trie_).symb_size_.mask_ = 0;
  (this->label_store_).ptrs_.
  super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->label_store_).ptrs_.
  super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->label_store_).ptrs_.
  super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->label_store_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->label_store_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->label_store_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->label_store_).size_ = 0;
  (this->label_store_).label_bytes_ = 0;
  (this->codes_)._M_elems[0] = '\0';
  (this->codes_)._M_elems[1] = '\0';
  (this->codes_)._M_elems[2] = '\0';
  (this->codes_)._M_elems[3] = '\0';
  (this->codes_)._M_elems[4] = '\0';
  (this->codes_)._M_elems[5] = '\0';
  (this->codes_)._M_elems[6] = '\0';
  (this->codes_)._M_elems[7] = '\0';
  (this->codes_)._M_elems[8] = '\0';
  (this->codes_)._M_elems[9] = '\0';
  (this->codes_)._M_elems[10] = '\0';
  (this->codes_)._M_elems[0xb] = '\0';
  (this->codes_)._M_elems[0xc] = '\0';
  (this->codes_)._M_elems[0xd] = '\0';
  (this->codes_)._M_elems[0xe] = '\0';
  (this->codes_)._M_elems[0xf] = '\0';
  (this->codes_)._M_elems[0x10] = '\0';
  (this->codes_)._M_elems[0x11] = '\0';
  (this->codes_)._M_elems[0x12] = '\0';
  (this->codes_)._M_elems[0x13] = '\0';
  (this->codes_)._M_elems[0x14] = '\0';
  (this->codes_)._M_elems[0x15] = '\0';
  (this->codes_)._M_elems[0x16] = '\0';
  (this->codes_)._M_elems[0x17] = '\0';
  (this->codes_)._M_elems[0x18] = '\0';
  (this->codes_)._M_elems[0x19] = '\0';
  (this->codes_)._M_elems[0x1a] = '\0';
  (this->codes_)._M_elems[0x1b] = '\0';
  (this->codes_)._M_elems[0x1c] = '\0';
  (this->codes_)._M_elems[0x1d] = '\0';
  (this->codes_)._M_elems[0x1e] = '\0';
  (this->codes_)._M_elems[0x1f] = '\0';
  (this->codes_)._M_elems[0x20] = '\0';
  (this->codes_)._M_elems[0x21] = '\0';
  (this->codes_)._M_elems[0x22] = '\0';
  (this->codes_)._M_elems[0x23] = '\0';
  (this->codes_)._M_elems[0x24] = '\0';
  (this->codes_)._M_elems[0x25] = '\0';
  (this->codes_)._M_elems[0x26] = '\0';
  (this->codes_)._M_elems[0x27] = '\0';
  (this->codes_)._M_elems[0x28] = '\0';
  (this->codes_)._M_elems[0x29] = '\0';
  (this->codes_)._M_elems[0x2a] = '\0';
  (this->codes_)._M_elems[0x2b] = '\0';
  (this->codes_)._M_elems[0x2c] = '\0';
  (this->codes_)._M_elems[0x2d] = '\0';
  (this->codes_)._M_elems[0x2e] = '\0';
  (this->codes_)._M_elems[0x2f] = '\0';
  (this->codes_)._M_elems[0x30] = '\0';
  (this->codes_)._M_elems[0x31] = '\0';
  (this->codes_)._M_elems[0x32] = '\0';
  (this->codes_)._M_elems[0x33] = '\0';
  (this->codes_)._M_elems[0x34] = '\0';
  (this->codes_)._M_elems[0x35] = '\0';
  (this->codes_)._M_elems[0x36] = '\0';
  (this->codes_)._M_elems[0x37] = '\0';
  (this->codes_)._M_elems[0x38] = '\0';
  (this->codes_)._M_elems[0x39] = '\0';
  (this->codes_)._M_elems[0x3a] = '\0';
  (this->codes_)._M_elems[0x3b] = '\0';
  (this->codes_)._M_elems[0x3c] = '\0';
  (this->codes_)._M_elems[0x3d] = '\0';
  (this->codes_)._M_elems[0x3e] = '\0';
  (this->codes_)._M_elems[0x3f] = '\0';
  (this->codes_)._M_elems[0x40] = '\0';
  (this->codes_)._M_elems[0x41] = '\0';
  (this->codes_)._M_elems[0x42] = '\0';
  (this->codes_)._M_elems[0x43] = '\0';
  (this->codes_)._M_elems[0x44] = '\0';
  (this->codes_)._M_elems[0x45] = '\0';
  (this->codes_)._M_elems[0x46] = '\0';
  (this->codes_)._M_elems[0x47] = '\0';
  (this->codes_)._M_elems[0x48] = '\0';
  (this->codes_)._M_elems[0x49] = '\0';
  (this->codes_)._M_elems[0x4a] = '\0';
  (this->codes_)._M_elems[0x4b] = '\0';
  (this->codes_)._M_elems[0x4c] = '\0';
  (this->codes_)._M_elems[0x4d] = '\0';
  (this->codes_)._M_elems[0x4e] = '\0';
  (this->codes_)._M_elems[0x4f] = '\0';
  (this->codes_)._M_elems[0x50] = '\0';
  (this->codes_)._M_elems[0x51] = '\0';
  (this->codes_)._M_elems[0x52] = '\0';
  (this->codes_)._M_elems[0x53] = '\0';
  (this->codes_)._M_elems[0x54] = '\0';
  (this->codes_)._M_elems[0x55] = '\0';
  (this->codes_)._M_elems[0x56] = '\0';
  (this->codes_)._M_elems[0x57] = '\0';
  (this->codes_)._M_elems[0x58] = '\0';
  (this->codes_)._M_elems[0x59] = '\0';
  (this->codes_)._M_elems[0x5a] = '\0';
  (this->codes_)._M_elems[0x5b] = '\0';
  (this->codes_)._M_elems[0x5c] = '\0';
  (this->codes_)._M_elems[0x5d] = '\0';
  (this->codes_)._M_elems[0x5e] = '\0';
  (this->codes_)._M_elems[0x5f] = '\0';
  (this->codes_)._M_elems[0x60] = '\0';
  (this->codes_)._M_elems[0x61] = '\0';
  (this->codes_)._M_elems[0x62] = '\0';
  (this->codes_)._M_elems[99] = '\0';
  (this->codes_)._M_elems[100] = '\0';
  (this->codes_)._M_elems[0x65] = '\0';
  (this->codes_)._M_elems[0x66] = '\0';
  (this->codes_)._M_elems[0x67] = '\0';
  (this->codes_)._M_elems[0x68] = '\0';
  (this->codes_)._M_elems[0x69] = '\0';
  (this->codes_)._M_elems[0x6a] = '\0';
  (this->codes_)._M_elems[0x6b] = '\0';
  (this->codes_)._M_elems[0x6c] = '\0';
  (this->codes_)._M_elems[0x6d] = '\0';
  (this->codes_)._M_elems[0x6e] = '\0';
  (this->codes_)._M_elems[0x6f] = '\0';
  (this->codes_)._M_elems[0x70] = '\0';
  (this->codes_)._M_elems[0x71] = '\0';
  (this->codes_)._M_elems[0x72] = '\0';
  (this->codes_)._M_elems[0x73] = '\0';
  (this->codes_)._M_elems[0x74] = '\0';
  (this->codes_)._M_elems[0x75] = '\0';
  (this->codes_)._M_elems[0x76] = '\0';
  (this->codes_)._M_elems[0x77] = '\0';
  (this->codes_)._M_elems[0x78] = '\0';
  (this->codes_)._M_elems[0x79] = '\0';
  (this->codes_)._M_elems[0x7a] = '\0';
  (this->codes_)._M_elems[0x7b] = '\0';
  (this->codes_)._M_elems[0x7c] = '\0';
  (this->codes_)._M_elems[0x7d] = '\0';
  (this->codes_)._M_elems[0x7e] = '\0';
  (this->codes_)._M_elems[0x7f] = '\0';
  (this->codes_)._M_elems[0x80] = '\0';
  (this->codes_)._M_elems[0x81] = '\0';
  (this->codes_)._M_elems[0x82] = '\0';
  (this->codes_)._M_elems[0x83] = '\0';
  (this->codes_)._M_elems[0x84] = '\0';
  (this->codes_)._M_elems[0x85] = '\0';
  (this->codes_)._M_elems[0x86] = '\0';
  (this->codes_)._M_elems[0x87] = '\0';
  (this->codes_)._M_elems[0x88] = '\0';
  (this->codes_)._M_elems[0x89] = '\0';
  (this->codes_)._M_elems[0x8a] = '\0';
  (this->codes_)._M_elems[0x8b] = '\0';
  (this->codes_)._M_elems[0x8c] = '\0';
  (this->codes_)._M_elems[0x8d] = '\0';
  (this->codes_)._M_elems[0x8e] = '\0';
  (this->codes_)._M_elems[0x8f] = '\0';
  (this->codes_)._M_elems[0x90] = '\0';
  (this->codes_)._M_elems[0x91] = '\0';
  (this->codes_)._M_elems[0x92] = '\0';
  (this->codes_)._M_elems[0x93] = '\0';
  (this->codes_)._M_elems[0x94] = '\0';
  (this->codes_)._M_elems[0x95] = '\0';
  (this->codes_)._M_elems[0x96] = '\0';
  (this->codes_)._M_elems[0x97] = '\0';
  (this->codes_)._M_elems[0x98] = '\0';
  (this->codes_)._M_elems[0x99] = '\0';
  (this->codes_)._M_elems[0x9a] = '\0';
  (this->codes_)._M_elems[0x9b] = '\0';
  (this->codes_)._M_elems[0x9c] = '\0';
  (this->codes_)._M_elems[0x9d] = '\0';
  (this->codes_)._M_elems[0x9e] = '\0';
  (this->codes_)._M_elems[0x9f] = '\0';
  (this->codes_)._M_elems[0xa0] = '\0';
  (this->codes_)._M_elems[0xa1] = '\0';
  (this->codes_)._M_elems[0xa2] = '\0';
  (this->codes_)._M_elems[0xa3] = '\0';
  (this->codes_)._M_elems[0xa4] = '\0';
  (this->codes_)._M_elems[0xa5] = '\0';
  (this->codes_)._M_elems[0xa6] = '\0';
  (this->codes_)._M_elems[0xa7] = '\0';
  (this->codes_)._M_elems[0xa8] = '\0';
  (this->codes_)._M_elems[0xa9] = '\0';
  (this->codes_)._M_elems[0xaa] = '\0';
  (this->codes_)._M_elems[0xab] = '\0';
  (this->codes_)._M_elems[0xac] = '\0';
  (this->codes_)._M_elems[0xad] = '\0';
  (this->codes_)._M_elems[0xae] = '\0';
  (this->codes_)._M_elems[0xaf] = '\0';
  (this->codes_)._M_elems[0xb0] = '\0';
  (this->codes_)._M_elems[0xb1] = '\0';
  (this->codes_)._M_elems[0xb2] = '\0';
  (this->codes_)._M_elems[0xb3] = '\0';
  (this->codes_)._M_elems[0xb4] = '\0';
  (this->codes_)._M_elems[0xb5] = '\0';
  (this->codes_)._M_elems[0xb6] = '\0';
  (this->codes_)._M_elems[0xb7] = '\0';
  (this->codes_)._M_elems[0xb8] = '\0';
  (this->codes_)._M_elems[0xb9] = '\0';
  (this->codes_)._M_elems[0xba] = '\0';
  (this->codes_)._M_elems[0xbb] = '\0';
  (this->codes_)._M_elems[0xbc] = '\0';
  (this->codes_)._M_elems[0xbd] = '\0';
  (this->codes_)._M_elems[0xbe] = '\0';
  (this->codes_)._M_elems[0xbf] = '\0';
  (this->codes_)._M_elems[0xc0] = '\0';
  (this->codes_)._M_elems[0xc1] = '\0';
  (this->codes_)._M_elems[0xc2] = '\0';
  (this->codes_)._M_elems[0xc3] = '\0';
  (this->codes_)._M_elems[0xc4] = '\0';
  (this->codes_)._M_elems[0xc5] = '\0';
  (this->codes_)._M_elems[0xc6] = '\0';
  (this->codes_)._M_elems[199] = '\0';
  (this->codes_)._M_elems[200] = '\0';
  (this->codes_)._M_elems[0xc9] = '\0';
  (this->codes_)._M_elems[0xca] = '\0';
  (this->codes_)._M_elems[0xcb] = '\0';
  (this->codes_)._M_elems[0xcc] = '\0';
  (this->codes_)._M_elems[0xcd] = '\0';
  (this->codes_)._M_elems[0xce] = '\0';
  (this->codes_)._M_elems[0xcf] = '\0';
  (this->codes_)._M_elems[0xd0] = '\0';
  (this->codes_)._M_elems[0xd1] = '\0';
  (this->codes_)._M_elems[0xd2] = '\0';
  (this->codes_)._M_elems[0xd3] = '\0';
  (this->codes_)._M_elems[0xd4] = '\0';
  (this->codes_)._M_elems[0xd5] = '\0';
  (this->codes_)._M_elems[0xd6] = '\0';
  (this->codes_)._M_elems[0xd7] = '\0';
  (this->codes_)._M_elems[0xd8] = '\0';
  (this->codes_)._M_elems[0xd9] = '\0';
  (this->codes_)._M_elems[0xda] = '\0';
  (this->codes_)._M_elems[0xdb] = '\0';
  (this->codes_)._M_elems[0xdc] = '\0';
  (this->codes_)._M_elems[0xdd] = '\0';
  (this->codes_)._M_elems[0xde] = '\0';
  (this->codes_)._M_elems[0xdf] = '\0';
  (this->codes_)._M_elems[0xe0] = '\0';
  (this->codes_)._M_elems[0xe1] = '\0';
  (this->codes_)._M_elems[0xe2] = '\0';
  (this->codes_)._M_elems[0xe3] = '\0';
  (this->codes_)._M_elems[0xe4] = '\0';
  (this->codes_)._M_elems[0xe5] = '\0';
  (this->codes_)._M_elems[0xe6] = '\0';
  (this->codes_)._M_elems[0xe7] = '\0';
  (this->codes_)._M_elems[0xe8] = '\0';
  (this->codes_)._M_elems[0xe9] = '\0';
  (this->codes_)._M_elems[0xea] = '\0';
  (this->codes_)._M_elems[0xeb] = '\0';
  (this->codes_)._M_elems[0xec] = '\0';
  (this->codes_)._M_elems[0xed] = '\0';
  (this->codes_)._M_elems[0xee] = '\0';
  (this->codes_)._M_elems[0xef] = '\0';
  (this->codes_)._M_elems[0xf0] = '\0';
  (this->codes_)._M_elems[0xf1] = '\0';
  (this->codes_)._M_elems[0xf2] = '\0';
  (this->codes_)._M_elems[0xf3] = '\0';
  (this->codes_)._M_elems[0xf4] = '\0';
  (this->codes_)._M_elems[0xf5] = '\0';
  (this->codes_)._M_elems[0xf6] = '\0';
  (this->codes_)._M_elems[0xf7] = '\0';
  (this->codes_)._M_elems[0xc4] = '\0';
  (this->codes_)._M_elems[0xc5] = '\0';
  (this->codes_)._M_elems[0xc6] = '\0';
  (this->codes_)._M_elems[199] = '\0';
  (this->codes_)._M_elems[200] = '\0';
  (this->codes_)._M_elems[0xc9] = '\0';
  (this->codes_)._M_elems[0xca] = '\0';
  (this->codes_)._M_elems[0xcb] = '\0';
  (this->codes_)._M_elems[0xcc] = '\0';
  (this->codes_)._M_elems[0xcd] = '\0';
  (this->codes_)._M_elems[0xce] = '\0';
  (this->codes_)._M_elems[0xcf] = '\0';
  (this->codes_)._M_elems[0xd0] = '\0';
  (this->codes_)._M_elems[0xd1] = '\0';
  (this->codes_)._M_elems[0xd2] = '\0';
  (this->codes_)._M_elems[0xd3] = '\0';
  (this->codes_)._M_elems[0xd4] = '\0';
  (this->codes_)._M_elems[0xd5] = '\0';
  (this->codes_)._M_elems[0xd6] = '\0';
  (this->codes_)._M_elems[0xd7] = '\0';
  (this->codes_)._M_elems[0xd8] = '\0';
  (this->codes_)._M_elems[0xd9] = '\0';
  (this->codes_)._M_elems[0xda] = '\0';
  (this->codes_)._M_elems[0xdb] = '\0';
  (this->codes_)._M_elems[0xdc] = '\0';
  (this->codes_)._M_elems[0xdd] = '\0';
  (this->codes_)._M_elems[0xde] = '\0';
  (this->codes_)._M_elems[0xdf] = '\0';
  (this->codes_)._M_elems[0xe0] = '\0';
  (this->codes_)._M_elems[0xe1] = '\0';
  (this->codes_)._M_elems[0xe2] = '\0';
  (this->codes_)._M_elems[0xe3] = '\0';
  (this->codes_)._M_elems[0xe4] = '\0';
  (this->codes_)._M_elems[0xe5] = '\0';
  (this->codes_)._M_elems[0xe6] = '\0';
  (this->codes_)._M_elems[0xe7] = '\0';
  (this->codes_)._M_elems[0xe8] = '\0';
  (this->codes_)._M_elems[0xe9] = '\0';
  (this->codes_)._M_elems[0xea] = '\0';
  (this->codes_)._M_elems[0xeb] = '\0';
  (this->codes_)._M_elems[0xec] = '\0';
  (this->codes_)._M_elems[0xed] = '\0';
  (this->codes_)._M_elems[0xee] = '\0';
  (this->codes_)._M_elems[0xef] = '\0';
  (this->codes_)._M_elems[0xf0] = '\0';
  (this->codes_)._M_elems[0xf1] = '\0';
  (this->codes_)._M_elems[0xf2] = '\0';
  (this->codes_)._M_elems[0xf3] = '\0';
  (this->codes_)._M_elems[0xf4] = '\0';
  (this->codes_)._M_elems[0xf5] = '\0';
  (this->codes_)._M_elems[0xf6] = '\0';
  (this->codes_)._M_elems[0xf7] = '\0';
  (this->codes_)._M_elems[0xf8] = '\0';
  (this->codes_)._M_elems[0xf9] = '\0';
  (this->codes_)._M_elems[0xfa] = '\0';
  (this->codes_)._M_elems[0xfb] = '\0';
  *(undefined8 *)((this->codes_)._M_elems + 0xfc) = 0;
  if ((int)POPCOUNT(lambda) == 1) {
    this->is_ready_ = true;
    this->lambda_ = lambda;
    uVar2 = 8;
    if (1 < lambda) {
      uVar2 = 9;
      if (lambda - 1 != 0) {
        uVar2 = 0x48 - (int)LZCOUNT(lambda - 1);
      }
    }
    plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>::plain_bonsai_trie(&local_98,capa_bits,uVar2)
    ;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&this->hash_trie_,&local_98)
    ;
    (this->hash_trie_).table_.width_ = local_98.table_.width_;
    (this->hash_trie_).table_.size_ = local_98.table_.size_;
    (this->hash_trie_).table_.mask_ = local_98.table_.mask_;
    (this->hash_trie_).capa_size_.bits_ = local_98.capa_size_.bits_;
    *(undefined4 *)&(this->hash_trie_).capa_size_.field_0x4 = local_98.capa_size_._4_4_;
    (this->hash_trie_).capa_size_.mask_ = local_98.capa_size_.mask_;
    (this->hash_trie_).symb_size_.bits_ = local_98.symb_size_.bits_;
    *(undefined4 *)&(this->hash_trie_).symb_size_.field_0x4 = local_98.symb_size_._4_4_;
    (this->hash_trie_).symb_size_.mask_ = local_98.symb_size_.mask_;
    (this->hash_trie_).size_ = local_98.size_;
    (this->hash_trie_).max_size_ = local_98.max_size_;
    (this->hash_trie_).capa_size_.bits_ = local_98.capa_size_.bits_;
    *(undefined4 *)&(this->hash_trie_).capa_size_.field_0x4 = local_98.capa_size_._4_4_;
    (this->hash_trie_).capa_size_.mask_ = local_98.capa_size_.mask_;
    if ((pointer)local_98.table_.chunks_.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_98.table_.chunks_.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_98.table_.chunks_.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_98.table_.chunks_.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    compact_bonsai_nlm<int,_64UL>::compact_bonsai_nlm
              ((compact_bonsai_nlm<int,_64UL> *)&local_98,(this->hash_trie_).capa_size_.bits_);
    local_38.
    super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (this->label_store_).ptrs_.
         super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_38.
    super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (this->label_store_).ptrs_.
         super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_38.
    super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (this->label_store_).ptrs_.
         super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->label_store_).ptrs_.
    super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)local_98.table_.chunks_.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start;
    (this->label_store_).ptrs_.
    super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)local_98.table_.chunks_.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_finish;
    (this->label_store_).ptrs_.
    super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)local_98.table_.chunks_.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
    local_98.table_.chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_98.table_.chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_98.table_.chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
    ::~vector(&local_38);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign
              (&(this->label_store_).chunks_,&local_98.table_.size_);
    auVar1._8_8_ = local_98.max_size_;
    auVar1._0_8_ = local_98.size_;
    auVar5 = ZEXT1664(auVar1);
    (this->label_store_).size_ = local_98.size_;
    (this->label_store_).label_bytes_ = local_98.max_size_;
    compact_bonsai_nlm<int,_64UL>::~compact_bonsai_nlm((compact_bonsai_nlm<int,_64UL> *)&local_98);
    auVar4 = vpternlogd_avx512f(auVar5,auVar5,auVar5,0xff);
    auVar5 = vmovdqu64_avx512f(auVar4);
    *(undefined1 (*) [64])(this->codes_)._M_elems = auVar5;
    auVar5 = vmovdqu64_avx512f(auVar4);
    *(undefined1 (*) [64])((this->codes_)._M_elems + 0xc0) = auVar5;
    auVar5 = vmovdqu64_avx512f(auVar4);
    *(undefined1 (*) [64])((this->codes_)._M_elems + 0x80) = auVar5;
    auVar5 = vmovdqu64_avx512f(auVar4);
    *(undefined1 (*) [64])((this->codes_)._M_elems + 0x40) = auVar5;
    uVar2 = this->num_codes_;
    this->num_codes_ = uVar2 + 1;
    (this->codes_)._M_elems[0] = (uchar)uVar2;
    return;
  }
  puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
  *puVar3 = &PTR__exception_00185a10;
  puVar3[1] = 
  "/workspace/llm4binary/github/license_c_cmakelists/kampersanda[P]poplar-trie/include/poplar/map.hpp:57:lambda must be a power of 2."
  ;
  __cxa_throw(puVar3,&exception::typeinfo,std::exception::~exception);
}

Assistant:

explicit map(uint32_t capa_bits, uint64_t lambda = 32) {
        POPLAR_THROW_IF(!is_power2(lambda), "lambda must be a power of 2.");

        is_ready_ = true;
        lambda_ = lambda;
        hash_trie_ = Trie{capa_bits, 8 + bit_tools::ceil_log2(lambda_)};
        label_store_ = NLM{hash_trie_.capa_bits()};
        codes_.fill(UINT8_MAX);
        codes_[0] = static_cast<uint8_t>(num_codes_++);  // terminator
    }